

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

string * __thiscall cmList::prepend(cmList *this,string *list,string_view value)

{
  allocator<char> local_41;
  string local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (char *)value._M_len;
  local_20._M_len = (size_t)list;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  prepend((string *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (string *)this;
}

Assistant:

std::string& cmList::prepend(std::string& list, cm::string_view value)
{
  return cmList::prepend(list, std::string{ value });
}